

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_parser_test.cc
# Opt level: O0

Test * ParserTestDyndepRuleInput::Create(void)

{
  Test *this;
  
  this = (Test *)operator_new(0x1e8);
  ParserTestDyndepRuleInput((ParserTestDyndepRuleInput *)this);
  g_current_test = this;
  return this;
}

Assistant:

TEST_F(ParserTest, DyndepRuleInput) {
  ASSERT_NO_FATAL_FAILURE(AssertParse(
"rule cat\n"
"  command = cat $in > $out\n"
"  dyndep = $in\n"
"build result: cat in\n"));
  Edge* edge = state.GetNode("result", 0)->in_edge();
  ASSERT_TRUE(edge->dyndep_);
  EXPECT_TRUE(edge->dyndep_->dyndep_pending());
  EXPECT_EQ(edge->dyndep_->path(), "in");
}